

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EulerAngles.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::LE_EulerAngles::Encode(LE_EulerAngles *this,KDataStream *stream)

{
  (*(this->m_Psi).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Psi);
  (*(this->m_Theta).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Theta,stream);
  (*(this->m_Phi).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Phi,stream);
  return;
}

Assistant:

void LE_EulerAngles::Encode( KDataStream & stream ) const
{
    stream << KDIS_STREAM m_Psi
           << KDIS_STREAM m_Theta
           << KDIS_STREAM m_Phi;
}